

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NameValuePragmaExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NameValuePragmaExpressionSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::PragmaExpressionSyntax&>
          (BumpAllocator *this,Token *args,Token *args_1,PragmaExpressionSyntax *args_2)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  NameValuePragmaExpressionSyntax *pNVar11;
  
  pNVar11 = (NameValuePragmaExpressionSyntax *)allocate(this,0x40,8);
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar2 = args_1->info;
  (pNVar11->super_PragmaExpressionSyntax).super_SyntaxNode.kind = NameValuePragmaExpression;
  (pNVar11->super_PragmaExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pNVar11->super_PragmaExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pNVar11->name).kind = TVar3;
  (pNVar11->name).field_0x2 = uVar4;
  (pNVar11->name).numFlags = (NumericTokenFlags)NVar5.raw;
  (pNVar11->name).rawLen = uVar6;
  (pNVar11->name).info = pIVar1;
  (pNVar11->equals).kind = TVar7;
  (pNVar11->equals).field_0x2 = uVar8;
  (pNVar11->equals).numFlags = (NumericTokenFlags)NVar9.raw;
  (pNVar11->equals).rawLen = uVar10;
  (pNVar11->equals).info = pIVar2;
  (pNVar11->value).ptr = args_2;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pNVar11;
  return pNVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }